

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

Instr * __thiscall IR::Instr::Clone(Instr *this)

{
  Func *pFVar1;
  Cloner *this_00;
  Func *func;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint32 offset;
  undefined4 *puVar5;
  LabelInstr *this_01;
  Opnd *pOVar6;
  
  if (this->m_kind - 1 < 10) {
    pFVar1 = this->m_func;
    this_00 = pFVar1->topFunc->m_cloner;
    switch((uint)this->m_kind) {
    case 1:
      this_01 = (LabelInstr *)CloneInstr(this);
      break;
    case 2:
      this_01 = (LabelInstr *)BranchInstr::CloneBranchInstr((BranchInstr *)this);
      break;
    case 3:
    case 5:
      this_01 = LabelInstr::CloneLabel((LabelInstr *)this,1);
      break;
    case 4:
      this_01 = (LabelInstr *)ProfiledInstr::CloneProfiledInstr((ProfiledInstr *)this);
      break;
    default:
      goto switchD_004bacfc_caseD_6;
    case 8:
      this_01 = (LabelInstr *)PragmaInstr::New(this->m_opcode,0,this->m_func);
      break;
    case 10:
      this_01 = (LabelInstr *)JitProfilingInstr::CloneJitProfiling((JitProfilingInstr *)this);
    }
    if (this->m_dst != (Opnd *)0x0) {
      pOVar6 = Opnd::CloneDef(this->m_dst,pFVar1);
      SetDst(&this_01->super_Instr,pOVar6);
    }
    if (this->m_src1 != (Opnd *)0x0) {
      pOVar6 = Opnd::CloneUse(this->m_src1,pFVar1);
      if ((this_01->super_Instr).m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar3) goto LAB_004bb02a;
        *puVar5 = 0;
      }
      func = (this_01->super_Instr).m_func;
      if (pOVar6->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar3) goto LAB_004bb02a;
        *puVar5 = 0;
      }
      bVar4 = pOVar6->field_0xb;
      if ((bVar4 & 2) != 0) {
        pOVar6 = Opnd::Copy(pOVar6,func);
        bVar4 = pOVar6->field_0xb;
      }
      pOVar6->field_0xb = bVar4 | 2;
      (this_01->super_Instr).m_src1 = pOVar6;
      if (this->m_src2 != (Opnd *)0x0) {
        pOVar6 = Opnd::CloneUse(this->m_src2,pFVar1);
        if ((this_01->super_Instr).m_src2 != (Opnd *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
          if (!bVar3) goto LAB_004bb02a;
          *puVar5 = 0;
        }
        pFVar1 = (this_01->super_Instr).m_func;
        if (pOVar6->isDeleted == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x14,"(!isDeleted)","Using deleted operand");
          if (!bVar3) goto LAB_004bb02a;
          *puVar5 = 0;
        }
        bVar4 = pOVar6->field_0xb;
        if ((bVar4 & 2) != 0) {
          pOVar6 = Opnd::Copy(pOVar6,pFVar1);
          bVar4 = pOVar6->field_0xb;
        }
        pOVar6->field_0xb = bVar4 | 2;
        (this_01->super_Instr).m_src2 = pOVar6;
      }
    }
    pFVar1 = this->m_func->topFunc;
    if ((pFVar1->hasInstrNumber == false) && (pFVar1->maintainByteCodeOffset == true)) {
      offset = GetByteCodeOffset(this);
      SetByteCodeOffset(&this_01->super_Instr,offset);
    }
    *(ushort *)&(this_01->super_Instr).field_0x36 =
         *(ushort *)&(this_01->super_Instr).field_0x36 & 0xffef |
         *(ushort *)&this->field_0x36 & 0x10;
    Cloner::AddInstr(this_00,this,&this_01->super_Instr);
  }
  else {
switchD_004bacfc_caseD_6:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x295,"(0)","Clone of this instr kind NYI");
    if (!bVar3) {
LAB_004bb02a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    this_01 = (LabelInstr *)0x0;
  }
  return &this_01->super_Instr;
}

Assistant:

Instr *
Instr::Clone()
{
    Func * func = this->m_func;
    Cloner *cloner = func->GetCloner();
    IR::Instr * instrClone;
    IR::Opnd * opnd;

    switch (this->GetKind())
    {
    case InstrKindInstr:
        instrClone = this->CloneInstr();
        break;
    case InstrKindBranch:
        instrClone = this->AsBranchInstr()->CloneBranchInstr();
        break;
    case InstrKindProfiled:
        instrClone = this->AsProfiledInstr()->CloneProfiledInstr();
        break;
    case InstrKindLabel:
    case InstrKindProfiledLabel:
        instrClone = this->AsLabelInstr()->CloneLabel(true);
        break;
    case InstrKindPragma:
        instrClone = this->AsPragmaInstr()->ClonePragma();
        break;
    case InstrKindJitProfiling:
        instrClone = this->AsJitProfilingInstr()->CloneJitProfiling();
        break;
    default:
        AssertMsg(0, "Clone of this instr kind NYI");
        return nullptr;
    }

    opnd = this->GetDst();
    if (opnd)
    {
        instrClone->SetDst(opnd->CloneDef(func));
    }
    opnd = this->GetSrc1();
    if (opnd)
    {
        instrClone->SetSrc1(opnd->CloneUse(func));
        opnd = this->GetSrc2();
        if (opnd)
        {
            instrClone->SetSrc2(opnd->CloneUse(func));
        }
    }
    if (this->m_func->DoMaintainByteCodeOffset())
    {
        instrClone->SetByteCodeOffset(this->GetByteCodeOffset());
    }
    instrClone->usesStackArgumentsObject = this->usesStackArgumentsObject;
    cloner->AddInstr(this, instrClone);

    return instrClone;
}